

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O3

_Bool pac_expand_impl(tsdn_t *tsdn,pai_t *self,edata_t *edata,size_t old_size,size_t new_size,
                     _Bool zero,_Bool *deferred_work_generated)

{
  _Bool _Var1;
  ehooks_t *ehooks;
  edata_t *b;
  size_t size;
  
  ehooks = duckdb_je_base_ehooks_get((base_t *)self[0x412].shrink);
  if (*(long *)((long)(ehooks->ptr).repr + 0x40) == 0) {
    return true;
  }
  size = new_size - old_size;
  b = duckdb_je_ecache_alloc
                (tsdn,(pac_t *)self,ehooks,(ecache_t *)(self + 1),edata,size,0x1000,zero,false);
  if ((b == (edata_t *)0x0) &&
     (b = duckdb_je_ecache_alloc
                    (tsdn,(pac_t *)self,ehooks,(ecache_t *)&self[0x15c].alloc_batch,edata,size,
                     0x1000,zero,false), b == (edata_t *)0x0)) {
    b = duckdb_je_ecache_alloc_grow
                  (tsdn,(pac_t *)self,ehooks,(ecache_t *)&self[0x2b7].expand,edata,size,0x1000,zero,
                   false);
    if (b == (edata_t *)0x0) {
      return true;
    }
    _Var1 = duckdb_je_extent_merge_wrapper(tsdn,(pac_t *)self,ehooks,edata,b);
    if (!_Var1) {
      if (new_size == old_size) {
        return false;
      }
      LOCK();
      *(size_t *)(self[0x457].alloc_batch + 0x38) = *(long *)(self[0x457].alloc_batch + 0x38) + size
      ;
      UNLOCK();
      return false;
    }
  }
  else {
    _Var1 = duckdb_je_extent_merge_wrapper(tsdn,(pac_t *)self,ehooks,edata,b);
    if (!_Var1) {
      return false;
    }
  }
  duckdb_je_extent_dalloc_wrapper(tsdn,(pac_t *)self,ehooks,b);
  return true;
}

Assistant:

static bool
pac_expand_impl(tsdn_t *tsdn, pai_t *self, edata_t *edata, size_t old_size,
    size_t new_size, bool zero, bool *deferred_work_generated) {
	pac_t *pac = (pac_t *)self;
	ehooks_t *ehooks = pac_ehooks_get(pac);

	size_t mapped_add = 0;
	size_t expand_amount = new_size - old_size;

	if (ehooks_merge_will_fail(ehooks)) {
		return true;
	}
	edata_t *trail = ecache_alloc(tsdn, pac, ehooks, &pac->ecache_dirty,
	    edata, expand_amount, PAGE, zero, /* guarded*/ false);
	if (trail == NULL) {
		trail = ecache_alloc(tsdn, pac, ehooks, &pac->ecache_muzzy,
		    edata, expand_amount, PAGE, zero, /* guarded*/ false);
	}
	if (trail == NULL) {
		trail = ecache_alloc_grow(tsdn, pac, ehooks,
		    &pac->ecache_retained, edata, expand_amount, PAGE, zero,
		    /* guarded */ false);
		mapped_add = expand_amount;
	}
	if (trail == NULL) {
		return true;
	}
	if (extent_merge_wrapper(tsdn, pac, ehooks, edata, trail)) {
		extent_dalloc_wrapper(tsdn, pac, ehooks, trail);
		return true;
	}
	if (config_stats && mapped_add > 0) {
		atomic_fetch_add_zu(&pac->stats->pac_mapped, mapped_add,
		    ATOMIC_RELAXED);
	}
	return false;
}